

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_static_counter<long>::serialize_default_label
          (basic_static_counter<long> *this,string *str,long value)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *__s;
  uint __len;
  ulong __val;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (str,(this->super_static_metric).super_metric_t.name_._M_dataplus._M_p,
             (this->super_static_metric).super_metric_t.name_._M_string_length);
  if ((this->super_static_metric).super_metric_t.labels_name_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->super_static_metric).super_metric_t.labels_name_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __s = " ";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,"{")
    ;
    build_string(this,str,&(this->super_static_metric).super_metric_t.labels_name_,
                 &(this->super_static_metric).super_metric_t.labels_value_);
    __s = "} ";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,__s);
  __val = -value;
  if (0 < value) {
    __val = value;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00163f0c;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00163f0c;
      }
      if (uVar3 < 10000) goto LAB_00163f0c;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00163f0c:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(__len - (int)(value >> 0x3f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p + -(value >> 0x3f),__len,__val);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (str,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(str,"\n");
  return;
}

Assistant:

void serialize_default_label(std::string &str, value_type value) {
    str.append(name_);
    if (labels_name_.empty()) {
      str.append(" ");
    }
    else {
      str.append("{");
      build_string(str, labels_name_, labels_value_);
      str.append("} ");
    }

    str.append(std::to_string(value));

    str.append("\n");
  }